

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringSlice(TranslateToFuzzReader *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  pEVar1 = makeTrappingRefUse(this,(HeapType)0x50);
  pEVar2 = make(this,(Type)0x2);
  pEVar3 = make(this,(Type)0x2);
  pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar4->_id = StringSliceWTFId;
  (pEVar4->type).id = 0;
  *(Expression **)(pEVar4 + 1) = pEVar1;
  pEVar4[1].type.id = (uintptr_t)pEVar2;
  *(Expression **)(pEVar4 + 2) = pEVar3;
  ::wasm::StringSliceWTF::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringSlice() {
  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* start = make(Type::i32);
  auto* end = make(Type::i32);
  return builder.makeStringSliceWTF(ref, start, end);
}